

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O0

void Qentem::Test::TestVariableTag4(QTest *test)

{
  StringStream<char> *pSVar1;
  Value<char> *this;
  undefined1 local_38 [8];
  Value<char> value;
  StringStream<char> ss;
  QTest *test_local;
  
  StringStream<char>::StringStream((StringStream<char> *)&value.type_);
  Value<char>::Value((Value<char> *)local_38);
  Value<char>::operator+=((Value<char> *)local_38,"<");
  Value<char>::operator+=((Value<char> *)local_38,">");
  Value<char>::operator+=((Value<char> *)local_38,"&");
  Value<char>::operator+=((Value<char> *)local_38,"\"");
  Value<char>::operator+=((Value<char> *)local_38,"\'");
  Value<char>::operator+=((Value<char> *)local_38,"<>");
  Value<char>::operator+=((Value<char> *)local_38,"<&");
  Value<char>::operator+=((Value<char> *)local_38,"<&");
  Value<char>::operator+=((Value<char> *)local_38,">\"");
  Value<char>::operator+=((Value<char> *)local_38,"\"\'");
  Value<char>::operator+=((Value<char> *)local_38,"<\">");
  Value<char>::operator+=((Value<char> *)local_38,"<\'>");
  Value<char>::operator+=((Value<char> *)local_38,"<&>");
  Value<char>::operator+=((Value<char> *)local_38,"&\"&");
  Value<char>::operator+=((Value<char> *)local_38,"\"\'\"");
  Value<char>::operator+=((Value<char> *)local_38,"\'<\'");
  Value<char>::operator+=((Value<char> *)local_38,"\'&\'");
  Value<char>::operator+=((Value<char> *)local_38,"<>&\'\"");
  Value<char>::operator+=((Value<char> *)local_38,"\'\"<>&");
  Value<char>::operator+=((Value<char> *)local_38,"<\"&\'>");
  Value<char>::operator+=((Value<char> *)local_38,"<<<<<");
  Value<char>::operator+=((Value<char> *)local_38,">>>>>");
  Value<char>::operator+=((Value<char> *)local_38,"&&&&&");
  Value<char>::operator+=((Value<char> *)local_38,"\"\"\"\"\"");
  Value<char>::operator+=((Value<char> *)local_38,"\'\'\'\'\'");
  Value<char>::operator+=((Value<char> *)local_38,"A<");
  Value<char>::operator+=((Value<char> *)local_38,"A>");
  Value<char>::operator+=((Value<char> *)local_38,"A&");
  Value<char>::operator+=((Value<char> *)local_38,"A\"");
  Value<char>::operator+=((Value<char> *)local_38,"A\'");
  Value<char>::operator+=((Value<char> *)local_38,"<A");
  Value<char>::operator+=((Value<char> *)local_38,">A");
  Value<char>::operator+=((Value<char> *)local_38,"&A");
  Value<char>::operator+=((Value<char> *)local_38,"\"A");
  Value<char>::operator+=((Value<char> *)local_38,"\'A");
  Value<char>::operator+=((Value<char> *)local_38,"A<A");
  Value<char>::operator+=((Value<char> *)local_38,"A>A");
  Value<char>::operator+=((Value<char> *)local_38,"A&A");
  Value<char>::operator+=((Value<char> *)local_38,"A\"A");
  Value<char>::operator+=((Value<char> *)local_38,"A\'A");
  Value<char>::operator+=((Value<char> *)local_38,"AA<AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA>AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA&AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA\"AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA\'AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA<<<<AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA>>>>AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA&&&&AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA\"\"\"\"AA");
  Value<char>::operator+=((Value<char> *)local_38,"AA\'\'\'\'AA");
  Value<char>::operator+=((Value<char> *)local_38,"<A>B\'C\"D&E\'F\"G<H>I&G\"K");
  Value<char>::operator+=((Value<char> *)local_38,"AB\"CD\'EF<GH>IGK\'");
  Value<char>::operator+=((Value<char> *)local_38,"\"ABC\'DEF<GHI>GK<");
  Value<char>::operator+=((Value<char> *)local_38,"A\"\"BC<<DE>>FG\'\'HI&&GK");
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:0}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar1,(char (*) [5])0x131328,0x289);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:1}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar1,(char (*) [5])0x131236,0x28c);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:2}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar1,(char (*) [6])0x131368,0x28f);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:3}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])0x1312c2,0x292);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:4}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])0x131724,0x295);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:5}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar1,(char (*) [9])"&lt;&gt;",0x298);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:6}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar1,(char (*) [10])"&lt;&amp;",0x29b);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:7}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar1,(char (*) [10])"&lt;&amp;",0x29e);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:8}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"&gt;&quot;",0x2a1)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:9}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[13]>
            (test,pSVar1,(char (*) [13])"&quot;&apos;",0x2a4);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:10}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (test,pSVar1,(char (*) [15])"&lt;&quot;&gt;",0x2a7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:11}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[15]>
            (test,pSVar1,(char (*) [15])"&lt;&apos;&gt;",0x2aa);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:12}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar1,(char (*) [14])"&lt;&amp;&gt;",0x2ad);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:13}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>
            (test,pSVar1,(char (*) [17])"&amp;&quot;&amp;",0x2b0);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:14}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[19]>
            (test,pSVar1,(char (*) [19])"&quot;&apos;&quot;",0x2b3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:15}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[17]>
            (test,pSVar1,(char (*) [17])"&apos;&lt;&apos;",0x2b6);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:16}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[18]>
            (test,pSVar1,(char (*) [18])"&apos;&amp;&apos;",0x2b9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:17}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (test,pSVar1,(char (*) [26])"&lt;&gt;&amp;&apos;&quot;",700);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:18}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (test,pSVar1,(char (*) [26])"&apos;&quot;&lt;&gt;&amp;",0x2bf);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:19}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (test,pSVar1,(char (*) [26])"&lt;&quot;&amp;&apos;&gt;",0x2c2);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:20}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (test,pSVar1,(char (*) [21])"&lt;&lt;&lt;&lt;&lt;",0x2c5);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:21}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (test,pSVar1,(char (*) [21])"&gt;&gt;&gt;&gt;&gt;",0x2c8);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:22}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[26]>
            (test,pSVar1,(char (*) [26])"&amp;&amp;&amp;&amp;&amp;",0x2cb);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:23}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[31]>
            (test,pSVar1,(char (*) [31])"&quot;&quot;&quot;&quot;&quot;",0x2ce);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:24}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[31]>
            (test,pSVar1,(char (*) [31])"&apos;&apos;&apos;&apos;&apos;",0x2d1);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:25}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar1,(char (*) [6])"A&lt;",0x2d4);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:26}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar1,(char (*) [6])"A&gt;",0x2d7);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:27}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"A&amp;",0x2da);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:28}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"A&quot;",0x2dd);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:29}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"A&apos;",0x2e0);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:30}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar1,(char (*) [6])0x131445,0x2e3);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:31}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[6]>(test,pSVar1,(char (*) [6])0x131455,0x2e6);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:32}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])0x131465,0x2e9);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:33}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])0x131476,0x2ec);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:34}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])0x131488,0x2ef);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:35}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"A&lt;A",0x2f2);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:36}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"A&gt;A",0x2f5);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:37}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"A&amp;A",0x2f8);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:38}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar1,(char (*) [9])"A&quot;A",0x2fb);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:39}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar1,(char (*) [9])"A&apos;A",0x2fe);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:40}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar1,(char (*) [9])"AA&lt;AA",0x301);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:41}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[9]>(test,pSVar1,(char (*) [9])"AA&gt;AA",0x304);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:42}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar1,(char (*) [10])"AA&amp;AA",0x307);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:43}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"AA&quot;AA",0x30a)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:44}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"AA&apos;AA",0x30d)
  ;
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:45}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (test,pSVar1,(char (*) [21])"AA&lt;&lt;&lt;&lt;AA",0x310);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:46}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[21]>
            (test,pSVar1,(char (*) [21])"AA&gt;&gt;&gt;&gt;AA",0x313);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:47}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[25]>
            (test,pSVar1,(char (*) [25])"AA&amp;&amp;&amp;&amp;AA",0x316);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:48}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (test,pSVar1,(char (*) [29])"AA&quot;&quot;&quot;&quot;AA",0x319);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:49}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[29]>
            (test,pSVar1,(char (*) [29])"AA&apos;&apos;&apos;&apos;AA",0x31c);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:50}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[68]>
            (test,pSVar1,
             (char (*) [68])"&lt;A&gt;B&apos;C&quot;D&amp;E&apos;F&quot;G&lt;H&gt;I&amp;G&quot;K",
             800);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:51}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[38]>
            (test,pSVar1,(char (*) [38])"AB&quot;CD&apos;EF&lt;GH&gt;IGK&apos;",0x323);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:52}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[36]>
            (test,pSVar1,(char (*) [36])"&quot;ABC&apos;DEF&lt;GHI&gt;GK&lt;",0x326);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:53}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[62]>
            (test,pSVar1,
             (char (*) [62])"A&quot;&quot;BC&lt;&lt;DE&gt;&gt;FG&apos;&apos;HI&amp;&amp;GK",0x32a);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:<\"&\'>}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[32]>
            (test,pSVar1,(char (*) [32])"{var:&lt;&quot;&amp;&apos;&gt;}",0x32d);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::Reset((Value<char> *)local_38);
  this = Value<char>::operator[]((Value<char> *)local_38,"abcd");
  Value<char>::operator=(this," &lt; < &gt; > &amp; & &quot; \" &apos; \'");
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{var:abcd}",(Value<char> *)local_38,(StringStream<char> *)&value.type_);
  QTest::IsEqual<Qentem::StringStream<char>,char[61]>
            (test,pSVar1,
             (char (*) [61])" &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;",0x3dc);
  StringStream<char>::Clear((StringStream<char> *)&value.type_);
  Value<char>::~Value((Value<char> *)local_38);
  StringStream<char>::~StringStream((StringStream<char> *)&value.type_);
  return;
}

Assistant:

static void TestVariableTag4(QTest &test) {
    StringStream<char> ss;
    Value<char>        value;

    value += R"(<)";
    value += R"(>)";
    value += R"(&)";
    value += R"(")";
    value += R"(')";
    value += R"(<>)";
    value += R"(<&)";
    value += R"(<&)";
    value += R"(>")";
    value += R"("')";
    value += R"(<">)";
    value += R"(<'>)";
    value += R"(<&>)";
    value += R"(&"&)";
    value += R"("'")";
    value += R"('<')";
    value += R"('&')";
    value += R"(<>&'")";
    value += R"('"<>&)";
    value += R"(<"&'>)";

    value += R"(<<<<<)";
    value += R"(>>>>>)";
    value += R"(&&&&&)";
    value += R"(""""")";
    value += R"(''''')";

    value += R"(A<)";
    value += R"(A>)";
    value += R"(A&)";
    value += R"(A")";
    value += R"(A')";
    value += R"(<A)";
    value += R"(>A)";
    value += R"(&A)";
    value += R"("A)";
    value += R"('A)";
    value += R"(A<A)";
    value += R"(A>A)";
    value += R"(A&A)";
    value += R"(A"A)";
    value += R"(A'A)";

    value += R"(AA<AA)";
    value += R"(AA>AA)";
    value += R"(AA&AA)";
    value += R"(AA"AA)";
    value += R"(AA'AA)";

    value += R"(AA<<<<AA)";
    value += R"(AA>>>>AA)";
    value += R"(AA&&&&AA)";
    value += R"(AA""""AA)";
    value += R"(AA''''AA)";

    value += R"(<A>B'C"D&E'F"G<H>I&G"K)";
    value += R"(AB"CD'EF<GH>IGK')";
    value += R"("ABC'DEF<GHI>GK<)";
    value += R"(A""BC<<DE>>FG''HI&&GK)";

    if (Config::AutoEscapeHTML) {
        test.IsEqual(Template::Render(R"({var:0})", value, ss), R"(&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:1})", value, ss), R"(&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:2})", value, ss), R"(&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:3})", value, ss), R"(&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:4})", value, ss), R"(&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:5})", value, ss), R"(&lt;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:6})", value, ss), R"(&lt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:7})", value, ss), R"(&lt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:8})", value, ss), R"(&gt;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:9})", value, ss), R"(&quot;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:10})", value, ss), R"(&lt;&quot;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:11})", value, ss), R"(&lt;&apos;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:12})", value, ss), R"(&lt;&amp;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:13})", value, ss), R"(&amp;&quot;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:14})", value, ss), R"(&quot;&apos;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:15})", value, ss), R"(&apos;&lt;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:16})", value, ss), R"(&apos;&amp;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:17})", value, ss), R"(&lt;&gt;&amp;&apos;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:18})", value, ss), R"(&apos;&quot;&lt;&gt;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:19})", value, ss), R"(&lt;&quot;&amp;&apos;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:20})", value, ss), R"(&lt;&lt;&lt;&lt;&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:21})", value, ss), R"(&gt;&gt;&gt;&gt;&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:22})", value, ss), R"(&amp;&amp;&amp;&amp;&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:23})", value, ss), R"(&quot;&quot;&quot;&quot;&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:24})", value, ss), R"(&apos;&apos;&apos;&apos;&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:25})", value, ss), R"(A&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:26})", value, ss), R"(A&gt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:27})", value, ss), R"(A&amp;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:28})", value, ss), R"(A&quot;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:29})", value, ss), R"(A&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:30})", value, ss), R"(&lt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:31})", value, ss), R"(&gt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:32})", value, ss), R"(&amp;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:33})", value, ss), R"(&quot;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:34})", value, ss), R"(&apos;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:35})", value, ss), R"(A&lt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:36})", value, ss), R"(A&gt;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:37})", value, ss), R"(A&amp;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:38})", value, ss), R"(A&quot;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:39})", value, ss), R"(A&apos;A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:40})", value, ss), R"(AA&lt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:41})", value, ss), R"(AA&gt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:42})", value, ss), R"(AA&amp;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:43})", value, ss), R"(AA&quot;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:44})", value, ss), R"(AA&apos;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:45})", value, ss), R"(AA&lt;&lt;&lt;&lt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:46})", value, ss), R"(AA&gt;&gt;&gt;&gt;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:47})", value, ss), R"(AA&amp;&amp;&amp;&amp;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:48})", value, ss), R"(AA&quot;&quot;&quot;&quot;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:49})", value, ss), R"(AA&apos;&apos;&apos;&apos;AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:50})", value, ss),
                     R"(&lt;A&gt;B&apos;C&quot;D&amp;E&apos;F&quot;G&lt;H&gt;I&amp;G&quot;K)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:51})", value, ss), R"(AB&quot;CD&apos;EF&lt;GH&gt;IGK&apos;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:52})", value, ss), R"(&quot;ABC&apos;DEF&lt;GHI&gt;GK&lt;)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:53})", value, ss),
                     R"(A&quot;&quot;BC&lt;&lt;DE&gt;&gt;FG&apos;&apos;HI&amp;&amp;GK)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:<"&'>})", value, ss), R"({var:&lt;&quot;&amp;&apos;&gt;})", __LINE__);
        ss.Clear();
    } else {
        test.IsEqual(Template::Render(R"({var:0})", value, ss), R"(<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:1})", value, ss), R"(>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:2})", value, ss), R"(&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:3})", value, ss), R"(")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:4})", value, ss), R"(')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:5})", value, ss), R"(<>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:6})", value, ss), R"(<&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:7})", value, ss), R"(<&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:8})", value, ss), R"(>")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:9})", value, ss), R"("')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:10})", value, ss), R"(<">)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:11})", value, ss), R"(<'>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:12})", value, ss), R"(<&>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:13})", value, ss), R"(&"&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:14})", value, ss), R"("'")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:15})", value, ss), R"('<')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:16})", value, ss), R"('&')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:17})", value, ss), R"(<>&'")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:18})", value, ss), R"('"<>&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:19})", value, ss), R"(<"&'>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:20})", value, ss), R"(<<<<<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:21})", value, ss), R"(>>>>>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:22})", value, ss), R"(&&&&&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:23})", value, ss), R"(""""")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:24})", value, ss), R"(''''')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:25})", value, ss), R"(A<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:26})", value, ss), R"(A>)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:27})", value, ss), R"(A&)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:28})", value, ss), R"(A")", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:29})", value, ss), R"(A')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:30})", value, ss), R"(<A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:31})", value, ss), R"(>A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:32})", value, ss), R"(&A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:33})", value, ss), R"("A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:34})", value, ss), R"('A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:35})", value, ss), R"(A<A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:36})", value, ss), R"(A>A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:37})", value, ss), R"(A&A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:38})", value, ss), R"(A"A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:39})", value, ss), R"(A'A)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:40})", value, ss), R"(AA<AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:41})", value, ss), R"(AA>AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:42})", value, ss), R"(AA&AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:43})", value, ss), R"(AA"AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:44})", value, ss), R"(AA'AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:45})", value, ss), R"(AA<<<<AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:46})", value, ss), R"(AA>>>>AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:47})", value, ss), R"(AA&&&&AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:48})", value, ss), R"(AA""""AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:49})", value, ss), R"(AA''''AA)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:50})", value, ss), R"(<A>B'C"D&E'F"G<H>I&G"K)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:51})", value, ss), R"(AB"CD'EF<GH>IGK')", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:52})", value, ss), R"("ABC'DEF<GHI>GK<)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:53})", value, ss), R"(A""BC<<DE>>FG''HI&&GK)", __LINE__);
        ss.Clear();

        test.IsEqual(Template::Render(R"({var:<"&'>})", value, ss), R"({var:<"&'>})", __LINE__);
        ss.Clear();
    }

    if (Config::AutoEscapeHTML) {
        value.Reset();

        value[R"(abcd)"] = R"( &lt; < &gt; > &amp; & &quot; " &apos; ')";

        test.IsEqual(Template::Render(R"({var:abcd})", value, ss),
                     R"( &lt; &lt; &gt; &gt; &amp; &amp; &quot; &quot; &apos; &apos;)", __LINE__);
        ss.Clear();
    }
}